

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O2

int Hsh_VecManAdd(Hsh_VecMan_t *p,Vec_Int_t *vVec)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  Hsh_VecObj_t *pHVar4;
  int *piVar5;
  ulong uVar6;
  int iVar7;
  Vec_Int_t *pVVar8;
  
  pVVar8 = p->vTable;
  iVar7 = pVVar8->nSize;
  if (iVar7 < p->vMap->nSize) {
    uVar1 = Abc_PrimeCudd(iVar7 * 2);
    Vec_IntGrow(pVVar8,uVar1);
    uVar3 = 0;
    uVar6 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar6 = uVar3;
    }
    for (; uVar6 != uVar3; uVar3 = uVar3 + 1) {
      pVVar8->pArray[uVar3] = -1;
    }
    pVVar8->nSize = uVar1;
    for (iVar7 = 0; pVVar8 = p->vTable, iVar7 < p->vMap->nSize; iVar7 = iVar7 + 1) {
      pHVar4 = Hsh_VecObj(p,iVar7);
      iVar2 = pHVar4->nSize;
      (p->vTemp).nCap = iVar2;
      (p->vTemp).nSize = iVar2;
      (p->vTemp).pArray = &pHVar4[1].nSize;
      iVar2 = Hsh_VecManHash(&p->vTemp,p->vTable->nSize);
      piVar5 = Vec_IntEntryP(pVVar8,iVar2);
      iVar2 = *piVar5;
      pHVar4 = Hsh_VecObj(p,iVar7);
      pHVar4->iNext = iVar2;
      *piVar5 = iVar7;
    }
    iVar7 = pVVar8->nSize;
  }
  iVar7 = Hsh_VecManHash(vVec,iVar7);
  piVar5 = Vec_IntEntryP(pVVar8,iVar7);
  while( true ) {
    pHVar4 = Hsh_VecObj(p,*piVar5);
    if (pHVar4 == (Hsh_VecObj_t *)0x0) {
      pVVar8 = p->vMap;
      *piVar5 = pVVar8->nSize;
      uVar1 = p->vData->nSize;
      if ((uVar1 & 1) == 0) {
        Vec_IntPush(pVVar8,uVar1);
        Vec_IntPush(p->vData,vVec->nSize);
        Vec_IntPush(p->vData,-1);
        for (iVar7 = 0; iVar7 < vVec->nSize; iVar7 = iVar7 + 1) {
          iVar2 = Vec_IntEntry(vVec,iVar7);
          Vec_IntPush(p->vData,iVar2);
        }
        if ((vVec->nSize & 1U) != 0) {
          Vec_IntPush(p->vData,-1);
        }
        return p->vMap->nSize + -1;
      }
      __assert_fail("Vec_IntSize(p->vData) % 2 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecHsh.h"
                    ,0x166,"int Hsh_VecManAdd(Hsh_VecMan_t *, Vec_Int_t *)");
    }
    if ((pHVar4->nSize == vVec->nSize) &&
       (iVar7 = bcmp(pHVar4 + 1,vVec->pArray,(long)pHVar4->nSize << 2), iVar7 == 0)) break;
    piVar5 = &pHVar4->iNext;
  }
  return *piVar5;
}

Assistant:

static inline int Hsh_VecManAdd( Hsh_VecMan_t * p, Vec_Int_t * vVec )
{
    Hsh_VecObj_t * pObj;
    int i, Ent, * pPlace;
    if ( Vec_IntSize(p->vMap) > Vec_IntSize(p->vTable) )
    {
        Vec_IntFill( p->vTable, Abc_PrimeCudd(2*Vec_IntSize(p->vTable)), -1 );
        for ( i = 0; i < Vec_IntSize(p->vMap); i++ )
        {
            pPlace = Vec_IntEntryP( p->vTable, Hsh_VecManHash(Hsh_VecReadEntry(p, i), Vec_IntSize(p->vTable)) );
            Hsh_VecObj(p, i)->iNext = *pPlace; *pPlace = i;
        }
    }
    pPlace = Vec_IntEntryP( p->vTable, Hsh_VecManHash(vVec, Vec_IntSize(p->vTable)) );
    for ( ; (pObj = Hsh_VecObj(p, *pPlace)); pPlace = &pObj->iNext )
        if ( pObj->nSize == Vec_IntSize(vVec) && !memcmp( pObj->pArray, Vec_IntArray(vVec), sizeof(int) * pObj->nSize ) )
            return *pPlace;
    *pPlace = Vec_IntSize(p->vMap);
    assert( Vec_IntSize(p->vData) % 2 == 0 );
    Vec_IntPush( p->vMap, Vec_IntSize(p->vData) );
    Vec_IntPush( p->vData, Vec_IntSize(vVec) );
    Vec_IntPush( p->vData, -1 );
    Vec_IntForEachEntry( vVec, Ent, i )
        Vec_IntPush( p->vData, Ent );
    if ( Vec_IntSize(vVec) & 1 )
        Vec_IntPush( p->vData, -1 );
    return Vec_IntSize(p->vMap) - 1;
}